

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

pair<int,_int> embree::quad_index3(int a0,int a1,int a2,int b0,int b1,int b2)

{
  pair<int,_int> pVar1;
  int iVar2;
  int p;
  
  iVar2 = a2;
  if (b0 == a0) {
    p = 0;
    b0 = b1;
  }
  else if (b0 == a1) {
    p = 1;
    iVar2 = a0;
    b0 = b1;
    a1 = a2;
  }
  else if (b0 == a2) {
    p = 2;
    iVar2 = a1;
    b0 = b1;
    a1 = a0;
  }
  else if (b1 == a0) {
    p = 0;
  }
  else if (b1 == a1) {
    p = 1;
    iVar2 = a0;
    a1 = a2;
  }
  else {
    if (b1 != a2) {
      if (b2 == a0) {
        pVar1 = quad_index2(0,a2,a1,b0,b1);
        return pVar1;
      }
      if (b2 != a1) {
        if (b2 != a2) {
          pVar1.first = 0;
          pVar1.second = -1;
          return pVar1;
        }
        pVar1 = quad_index2(2,a1,a0,b0,b1);
        return pVar1;
      }
      pVar1 = quad_index2(1,a0,a2,b0,b1);
      return pVar1;
    }
    p = 2;
    iVar2 = a1;
    a1 = a0;
  }
  pVar1 = quad_index2(p,iVar2,a1,b0,b2);
  return pVar1;
}

Assistant:

std::pair<int,int> quad_index3(int a0, int a1, int a2, int b0, int b1, int b2)
  {
    if      (b0 == a0) return quad_index2(0,a2,a1,b1,b2);
    else if (b0 == a1) return quad_index2(1,a0,a2,b1,b2);
    else if (b0 == a2) return quad_index2(2,a1,a0,b1,b2);
    else if (b1 == a0) return quad_index2(0,a2,a1,b0,b2);
    else if (b1 == a1) return quad_index2(1,a0,a2,b0,b2);
    else if (b1 == a2) return quad_index2(2,a1,a0,b0,b2);
    else if (b2 == a0) return quad_index2(0,a2,a1,b0,b1);
    else if (b2 == a1) return quad_index2(1,a0,a2,b0,b1);
    else if (b2 == a2) return quad_index2(2,a1,a0,b0,b1);
    else return std::make_pair(0,-1);
  }